

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall helics::TimeData::update(TimeData *this,TimeData *update)

{
  bool bVar1;
  baseType *in_RSI;
  TimeRepresentation<count_time<9,_long>_> *in_RDI;
  Time prev_next;
  bool updated;
  TimeRepresentation<count_time<9,_long>_> local_20;
  byte local_11;
  baseType *local_10;
  
  local_11 = (char)in_RDI[6].internalTimeCode != (char)in_RSI[6];
  *(char *)&in_RDI[6].internalTimeCode = (char)in_RSI[6];
  local_20.internalTimeCode = in_RDI->internalTimeCode;
  in_RDI->internalTimeCode = *in_RSI;
  local_10 = in_RSI;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 1),in_RDI + 1);
  if (bVar1) {
    local_11 = 1;
    in_RDI[1].internalTimeCode = local_10[1];
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)(local_10 + 2),in_RDI + 2);
  if (bVar1) {
    local_11 = 1;
    in_RDI[2].internalTimeCode = local_10[2];
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)(local_10 + 3),in_RDI + 3);
  if (bVar1) {
    local_11 = 1;
    in_RDI[3].internalTimeCode = local_10[3];
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=(&local_20,in_RDI);
  if (bVar1) {
    local_11 = 1;
  }
  bVar1 = GlobalFederateId::operator!=
                    ((GlobalFederateId *)(local_10 + 5),
                     (GlobalFederateId)(BaseType)in_RDI[5].internalTimeCode);
  if (bVar1) {
    *(int *)&in_RDI[5].internalTimeCode = (int)local_10[5];
    local_11 = 1;
  }
  if (*(int *)((long)local_10 + 0x3c) != *(int *)((long)&in_RDI[7].internalTimeCode + 4)) {
    *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) = *(undefined4 *)((long)local_10 + 0x3c);
  }
  if ((*(byte *)((long)local_10 + 0x32) & 1) !=
      (*(byte *)((long)&in_RDI[6].internalTimeCode + 2) & 1)) {
    *(byte *)((long)&in_RDI[6].internalTimeCode + 2) = *(byte *)((long)local_10 + 0x32) & 1;
    local_11 = 1;
  }
  if ((int)local_10[8] != (int)in_RDI[8].internalTimeCode) {
    *(int *)&in_RDI[8].internalTimeCode = (int)local_10[8];
    local_11 = 1;
  }
  bVar1 = GlobalFederateId::operator!=
                    ((GlobalFederateId *)((long)local_10 + 0x2c),
                     (GlobalFederateId)*(BaseType *)((long)&in_RDI[5].internalTimeCode + 4));
  if (bVar1) {
    *(undefined4 *)((long)&in_RDI[5].internalTimeCode + 4) = *(undefined4 *)((long)local_10 + 0x2c);
    local_11 = 1;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool TimeData::update(const TimeData& update)
{
    bool updated = (mTimeState != update.mTimeState);
    mTimeState = update.mTimeState;

    const Time prev_next = next;
    next = update.next;

    if (update.Te != Te) {
        updated = true;
        Te = update.Te;
    }

    if (update.minDe != minDe) {
        updated = true;
        minDe = update.minDe;
    }
    if (update.TeAlt != TeAlt) {
        updated = true;
        TeAlt = update.TeAlt;
    }

    if (prev_next != next) {
        updated = true;
    }

    if (update.minFed != minFed) {
        minFed = update.minFed;
        updated = true;
    }
    if (update.sequenceCounter != sequenceCounter) {
        sequenceCounter = update.sequenceCounter;
    }

    if (update.interrupted != interrupted) {
        interrupted = update.interrupted;
        updated = true;
    }

    if (update.responseSequenceCounter != responseSequenceCounter) {
        responseSequenceCounter = update.responseSequenceCounter;
        updated = true;
    }
    if (update.minFedActual != minFedActual) {
        minFedActual = update.minFedActual;
        updated = true;
    }

    return updated;
}